

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.cpp
# Opt level: O2

size_t miniscript::internal::ComputeScriptLen
                 (Fragment fragment,Type sub0typ,size_t subsize,uint32_t k,size_t n_subs,
                 size_t n_keys,MiniscriptContext ms_ctx)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  long in_FS_OFFSET;
  size_t sStack_80;
  size_t n_keys_local;
  uint32_t k_local;
  prevector<28U,_unsigned_char,_unsigned_int,_int> local_60;
  prevector<28U,_unsigned_char,_unsigned_int,_int> local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  sStack_80 = 1;
  n_keys_local = n_keys;
  k_local = k;
  switch(fragment) {
  case JUST_0:
  case JUST_1:
    goto switchD_003359d7_caseD_0;
  case PK_K:
    bVar1 = IsTapscript(ms_ctx);
    sStack_80 = 0x22 - (ulong)bVar1;
    goto switchD_003359d7_caseD_0;
  case PK_H:
    sStack_80 = 0x18;
    goto switchD_003359d7_caseD_0;
  case OLDER:
  case AFTER:
    BuildScript<unsigned_int&>((CScript *)&local_40,&k_local);
    uVar3 = local_40._size - 0x1d;
    if (local_40._size < 0x1d) {
      uVar3 = local_40._size;
    }
    sStack_80 = (size_t)(uVar3 + 1);
    goto LAB_00335b00;
  case SHA256:
  case HASH256:
    sStack_80 = 0x27;
    goto switchD_003359d7_caseD_0;
  case RIPEMD160:
  case HASH160:
    sStack_80 = 0x1b;
    goto switchD_003359d7_caseD_0;
  case WRAP_A:
  case OR_C:
    subsize = subsize + 2;
    break;
  case WRAP_S:
  case WRAP_C:
  case WRAP_N:
  case AND_B:
  case OR_B:
    subsize = subsize + 1;
    break;
  case WRAP_D:
  case OR_D:
  case OR_I:
  case ANDOR:
    subsize = subsize + 3;
    break;
  case WRAP_V:
    subsize = subsize + ((sub0typ.m_flags >> 0xd & 1) != 0);
    break;
  case WRAP_J:
    subsize = subsize + 4;
    break;
  case AND_V:
    break;
  case THRESH:
    BuildScript<unsigned_int&>((CScript *)&local_40,&k_local);
    uVar3 = local_40._size - 0x1d;
    if (local_40._size < 0x1d) {
      uVar3 = local_40._size;
    }
    sStack_80 = (ulong)uVar3 + n_subs + subsize;
    goto LAB_00335b00;
  case MULTI:
    BuildScript<unsigned_long&>((CScript *)&local_40,&n_keys_local);
    BuildScript<unsigned_int&>((CScript *)&local_60,&k_local);
    uVar3 = local_40._size - 0x1d;
    if (local_40._size < 0x1d) {
      uVar3 = local_40._size;
    }
    uVar2 = local_60._size - 0x1d;
    if (local_60._size < 0x1d) {
      uVar2 = local_60._size;
    }
    sStack_80 = n_keys_local * 0x22 + (ulong)(uVar3 + uVar2 + 1);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&local_60);
    goto LAB_00335b00;
  case MULTI_A:
    BuildScript<unsigned_int&>((CScript *)&local_40,&k_local);
    uVar3 = local_40._size - 0x1d;
    if (local_40._size < 0x1d) {
      uVar3 = local_40._size;
    }
    sStack_80 = n_keys * 0x22 + (ulong)uVar3 + 1;
LAB_00335b00:
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&local_40);
    goto switchD_003359d7_caseD_0;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.cpp"
                  ,0x125,
                  "size_t miniscript::internal::ComputeScriptLen(Fragment, Type, size_t, uint32_t, size_t, size_t, MiniscriptContext)"
                 );
  }
  sStack_80 = subsize;
switchD_003359d7_caseD_0:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return sStack_80;
}

Assistant:

size_t ComputeScriptLen(Fragment fragment, Type sub0typ, size_t subsize, uint32_t k, size_t n_subs,
                        size_t n_keys, MiniscriptContext ms_ctx) {
    switch (fragment) {
        case Fragment::JUST_1:
        case Fragment::JUST_0: return 1;
        case Fragment::PK_K: return IsTapscript(ms_ctx) ? 33 : 34;
        case Fragment::PK_H: return 3 + 21;
        case Fragment::OLDER:
        case Fragment::AFTER: return 1 + BuildScript(k).size();
        case Fragment::HASH256:
        case Fragment::SHA256: return 4 + 2 + 33;
        case Fragment::HASH160:
        case Fragment::RIPEMD160: return 4 + 2 + 21;
        case Fragment::MULTI: return 1 + BuildScript(n_keys).size() + BuildScript(k).size() + 34 * n_keys;
        case Fragment::MULTI_A: return (1 + 32 + 1) * n_keys + BuildScript(k).size() + 1;
        case Fragment::AND_V: return subsize;
        case Fragment::WRAP_V: return subsize + (sub0typ << "x"_mst);
        case Fragment::WRAP_S:
        case Fragment::WRAP_C:
        case Fragment::WRAP_N:
        case Fragment::AND_B:
        case Fragment::OR_B: return subsize + 1;
        case Fragment::WRAP_A:
        case Fragment::OR_C: return subsize + 2;
        case Fragment::WRAP_D:
        case Fragment::OR_D:
        case Fragment::OR_I:
        case Fragment::ANDOR: return subsize + 3;
        case Fragment::WRAP_J: return subsize + 4;
        case Fragment::THRESH: return subsize + n_subs + BuildScript(k).size();
    }
    assert(false);
}